

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall
OpenMD::LessThanOrEqualToConstraint<int>::LessThanOrEqualToConstraint
          (LessThanOrEqualToConstraint<int> *this,int rhs)

{
  ostream *this_00;
  int in_ESI;
  string *in_RDI;
  stringstream iss;
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [380];
  int local_c;
  
  local_c = in_ESI;
  ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<int>_>::ParamConstraintFacade
            ((ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<int>_> *)0x26e0a8);
  *(int *)(in_RDI + 0x20) = local_c;
  std::__cxx11::stringstream::stringstream(local_198);
  this_00 = std::operator<<(local_188,"less than or equal to");
  std::ostream::operator<<(this_00,local_c);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=(in_RDI,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

LessThanOrEqualToConstraint(T rhs) : rhs_(rhs) {
      std::stringstream iss;
      iss << "less than or equal to" << rhs;
      this->description_ = iss.str();
    }